

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::DestroyPool(VmaAllocator_T *this,VmaPool pool)

{
  VmaAllocator in_RDI;
  VmaMutexLockWrite lock;
  VmaPool_T *in_stack_ffffffffffffffc8;
  ItemType *in_stack_ffffffffffffffd8;
  VmaIntrusiveLinkedList<VmaPoolListItemTraits> *in_stack_ffffffffffffffe0;
  
  VmaMutexLockWrite::VmaMutexLockWrite
            ((VmaMutexLockWrite *)in_stack_ffffffffffffffe0,(VmaRWMutex *)in_stack_ffffffffffffffd8,
             SUB81((ulong)in_RDI >> 0x38,0));
  VmaIntrusiveLinkedList<VmaPoolListItemTraits>::Remove
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  VmaMutexLockWrite::~VmaMutexLockWrite((VmaMutexLockWrite *)in_RDI);
  vma_delete<VmaPool_T>(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void VmaAllocator_T::DestroyPool(VmaPool pool)
{
    // Remove from m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        m_Pools.Remove(pool);
    }

    vma_delete(this, pool);
}